

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parseSlots(Moc *this,ClassDef *def,Access access)

{
  bool bVar1;
  Token TVar2;
  undefined4 in_EDX;
  ClassDef *in_RSI;
  Moc *in_RDI;
  long in_FS_OFFSET;
  FunctionDef funcDef;
  QTypeRevision defaultRevision;
  Token in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 local_e0 [20];
  Token in_stack_ffffffffffffff34;
  Moc *in_stack_ffffffffffffff38;
  Moc *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  int local_24;
  QTypeRevision local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a.m_minorVersion = 0xaa;
  local_a.m_majorVersion = 0xaa;
  QTypeRevision::QTypeRevision(&local_a);
  bVar1 = Parser::test((Parser *)CONCAT44(in_EDX,in_stack_ffffffffffffff08),
                       (Token)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    local_a = parseRevision(in_stack_ffffffffffffff40);
  }
  Parser::next(&in_RDI->super_Parser,in_stack_fffffffffffffefc);
LAB_00134c66:
  while( true ) {
    do {
      bVar1 = inClass(in_RDI,in_RSI);
      in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
      if (bVar1) {
        bVar1 = Parser::hasNext(&in_RDI->super_Parser);
        in_stack_fffffffffffffefc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
      }
      if ((char)(in_stack_fffffffffffffefc >> 0x18) == '\0') goto LAB_00134e3c;
      TVar2 = Parser::next((Parser *)CONCAT44(in_EDX,in_stack_ffffffffffffff08));
    } while (TVar2 == SEMIC);
    if (TVar2 != FRIEND) break;
    until(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  }
  if (2 < TVar2 - PRIVATE) {
    if (TVar2 == USING) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        Parser::error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      goto LAB_00134e5a;
    }
    if (TVar2 != Q_SIGNALS_TOKEN && TVar2 != Q_SLOTS_TOKEN) {
      Parser::prev(&in_RDI->super_Parser);
      memset(local_e0,0xaa,0xd0);
      FunctionDef::FunctionDef((FunctionDef *)in_RDI);
      bVar1 = parseFunction((Moc *)in_RSI,(FunctionDef *)CONCAT44(in_EDX,in_stack_ffffffffffffff08),
                            SUB81((ulong)in_RDI >> 0x38,0));
      if (bVar1) {
        if (local_24 < 1) {
          bVar1 = QTypeRevision::isValid((QTypeRevision *)in_RDI);
          if (bVar1) {
            local_24 = QTypeRevision::toEncodedVersion<int,_true>(&local_a);
            in_RSI->revisionedMethods = in_RSI->revisionedMethods + 1;
          }
        }
        else {
          in_RSI->revisionedMethods = in_RSI->revisionedMethods + 1;
        }
        QList<FunctionDef>::operator+=
                  ((QList<FunctionDef> *)in_RDI,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffefc,TVar2));
        handleDefaultArguments
                  ((QList<FunctionDef> *)in_RDI,
                   (FunctionDef *)CONCAT44(in_stack_fffffffffffffefc,TVar2));
        in_stack_ffffffffffffff08 = 0;
      }
      else {
        in_stack_ffffffffffffff08 = 2;
      }
      FunctionDef::~FunctionDef((FunctionDef *)in_RDI);
      goto LAB_00134c66;
    }
  }
  Parser::prev(&in_RDI->super_Parser);
LAB_00134e3c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00134e5a:
  __stack_chk_fail();
}

Assistant:

void Moc::parseSlots(ClassDef *def, FunctionDef::Access access)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'slots' section");
        default:
            prev();
        }

        FunctionDef funcDef;
        funcDef.access = access;
        if (!parseFunction(&funcDef))
            continue;
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->slotList += funcDef;
        handleDefaultArguments(&def->slotList, funcDef);
    }
}